

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

void __thiscall llvm::APInt::setBits(APInt *this,uint loBit,uint hiBit)

{
  bool bVar1;
  ulong uVar2;
  uint64_t mask;
  uint hiBit_local;
  uint loBit_local;
  APInt *this_local;
  
  if (this->BitWidth < hiBit) {
    __assert_fail("hiBit <= BitWidth && \"hiBit out of range\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                  ,0x584,"void llvm::APInt::setBits(unsigned int, unsigned int)");
  }
  if (loBit <= this->BitWidth) {
    if (loBit <= hiBit) {
      if (loBit != hiBit) {
        if ((loBit < 0x40) && (hiBit < 0x41)) {
          uVar2 = (0xffffffffffffffffU >> (0x40 - ((char)hiBit - (byte)loBit) & 0x3f)) <<
                  ((byte)loBit & 0x3f);
          bVar1 = isSingleWord(this);
          if (bVar1) {
            (this->U).VAL = uVar2 | (this->U).VAL;
          }
          else {
            *(this->U).pVal = uVar2 | *(this->U).pVal;
          }
        }
        else {
          setBitsSlowCase(this,loBit,hiBit);
        }
      }
      return;
    }
    __assert_fail("loBit <= hiBit && \"loBit greater than hiBit\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                  ,0x586,"void llvm::APInt::setBits(unsigned int, unsigned int)");
  }
  __assert_fail("loBit <= BitWidth && \"loBit out of range\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                ,0x585,"void llvm::APInt::setBits(unsigned int, unsigned int)");
}

Assistant:

void setBits(unsigned loBit, unsigned hiBit) {
    assert(hiBit <= BitWidth && "hiBit out of range");
    assert(loBit <= BitWidth && "loBit out of range");
    assert(loBit <= hiBit && "loBit greater than hiBit");
    if (loBit == hiBit)
      return;
    if (loBit < APINT_BITS_PER_WORD && hiBit <= APINT_BITS_PER_WORD) {
      uint64_t mask = WORD_MAX >> (APINT_BITS_PER_WORD - (hiBit - loBit));
      mask <<= loBit;
      if (isSingleWord())
        U.VAL |= mask;
      else
        U.pVal[0] |= mask;
    } else {
      setBitsSlowCase(loBit, hiBit);
    }
  }